

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O1

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx,MppMeta meta)

{
  ushort uVar1;
  RK_U32 RVar2;
  void *__s;
  long lVar3;
  byte bVar4;
  int iVar5;
  Vepu580RoiH265BsCfg val;
  RK_U32 offset_1;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  undefined8 uVar15;
  long lVar16;
  ulong uVar17;
  ushort uVar18;
  ushort uVar19;
  ulong uVar20;
  ulong uVar21;
  RK_U32 *buf;
  ulong uVar22;
  Vepu580RoiQpCfg *qp_cfg_base;
  void *pvVar23;
  bool bVar24;
  RK_S32 cu16_num_line;
  
  iVar5 = *(int *)((long)ctx + 0x20);
  if (iVar5 == 0x10) {
    lVar3 = *(long *)((long)ctx + 0x38);
    iVar5 = *(int *)((long)ctx + 0x1c);
    if (0 < (long)iVar5) {
      lVar10 = *(long *)((long)ctx + 0x10);
      puVar13 = (undefined1 *)(lVar3 + 0xf);
      lVar16 = 0;
      do {
        *(undefined2 *)(puVar13 + -0xf) = *(undefined2 *)(lVar10 + lVar16);
        *(undefined2 *)(puVar13 + -0xd) = *(undefined2 *)(lVar10 + 2 + lVar16);
        *(undefined2 *)(puVar13 + -0xb) = *(undefined2 *)(lVar10 + 4 + lVar16);
        *(undefined2 *)(puVar13 + -9) = *(undefined2 *)(lVar10 + 6 + lVar16);
        *(undefined2 *)(puVar13 + -7) = *(undefined2 *)(lVar10 + 8 + lVar16);
        *puVar13 = *(undefined1 *)(lVar10 + 0xc + lVar16);
        *(undefined2 *)(puVar13 + -5) = *(undefined2 *)(lVar10 + 0x10 + lVar16);
        puVar13[-1] = 1;
        *(undefined2 *)(puVar13 + -3) = 0;
        puVar13 = puVar13 + 0x10;
        lVar16 = lVar16 + 0x14;
      } while ((long)iVar5 * 0x14 != lVar16);
    }
    *(int *)((long)ctx + 0x28) = iVar5;
    *(long *)((long)ctx + 0x30) = lVar3;
    mpp_meta_set_ptr(meta,0x726f6920,(long)ctx + 0x28);
  }
  else {
    if (iVar5 == 2) {
      gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
      if (*(int *)((long)ctx + 8) == 0x1000004) {
        lVar3 = *(long *)((long)ctx + 0xb8);
        pvVar23 = *(void **)((long)ctx + 0x80);
        buf = *(RK_U32 **)((long)ctx + 0x78);
        if (buf != (RK_U32 *)0x0 && (pvVar23 != (void *)0x0 && lVar3 != 0)) {
          uVar12 = *ctx + 0x3f >> 6;
          uVar9 = *(int *)((long)ctx + 4) + 0x3f >> 6;
          memset(pvVar23,0,(long)(int)(uVar9 * uVar12 * 0x100));
          memset(buf,0,(long)(int)(uVar9 * uVar12 * 0x40));
          if (0 < (int)uVar9) {
            uVar17 = 0;
            do {
              if (0 < (int)uVar12) {
                uVar20 = 0;
                do {
                  if (*(char *)(uVar17 * uVar12 + *(long *)((long)ctx + 0xa8) + uVar20) != '\0') {
                    uVar21 = 0;
                    iVar5 = 0;
                    do {
                      uVar14 = (ulong)((((uint)(uVar21 >> 2) & 0x3fffffff) + (int)uVar17 * 4) *
                                       uVar12 * 4 + ((uint)uVar21 & 3 | (int)uVar20 * 4));
                      RVar2 = raster2zscan16[uVar21];
                      uVar1 = *(ushort *)(lVar3 + uVar14 * 2);
                      bVar11 = (char)uVar1 * '\b' & 8;
                      bVar24 = (uVar1 & 0x7f00) != 0;
                      val = (Vepu580RoiH265BsCfg)(bVar24 * '\x02' | bVar11);
                      bVar11 = bVar11 >> 3;
                      iVar5 = (uint)(bVar24 | bVar11) + iVar5;
                      set_roi_cu16_split_cu8(buf,(uint)uVar21,val);
                      uVar8 = (uint)bVar24;
                      buf[RVar2 + 0x1e9 >> 5] =
                           buf[RVar2 + 0x1e9 >> 5] | uVar8 << ((byte)(RVar2 + 0x1e9) & 0x1f);
                      uVar6 = RVar2 * 2 + 0x12a;
                      buf[uVar6 >> 5] = buf[uVar6 >> 5] | (uint)bVar11 << ((byte)uVar6 & 0x1f);
                      uVar22 = (ulong)(RVar2 + 0x40);
                      uVar18 = *(ushort *)(lVar3 + uVar14 * 2) & 0x7f00;
                      uVar1 = *(ushort *)((long)pvVar23 + uVar22 * 2);
                      *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar1 & 0x80ff | uVar18;
                      uVar19 = *(ushort *)(lVar3 + uVar14 * 2) & 0x8000;
                      *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar1 & 0xff | uVar18 | uVar19;
                      *(ushort *)((long)pvVar23 + uVar22 * 2) =
                           uVar1 & 0xf | uVar18 | uVar19 | *(ushort *)(lVar3 + uVar14 * 2) & 0x70;
                      if ((uVar21 == 0xf) && (iVar5 == 0x10)) {
                        buf[0xf] = buf[0xf] | uVar8 << 0x1d;
                        buf[10] = buf[10] | (uint)bVar11 << 0x12;
                        uVar18 = *(ushort *)(lVar3 + uVar14 * 2) & 0x7f00;
                        uVar1 = *(ushort *)((long)pvVar23 + 0xa8);
                        *(ushort *)((long)pvVar23 + 0xa8) = uVar1 & 0x80ff | uVar18;
                        uVar19 = *(ushort *)(lVar3 + uVar14 * 2) & 0x8000;
                        *(ushort *)((long)pvVar23 + 0xa8) = uVar1 & 0xff | uVar18 | uVar19;
                        *(ushort *)((long)pvVar23 + 0xa8) =
                             uVar1 & 0xf | uVar18 | uVar19 | *(ushort *)(lVar3 + uVar14 * 2) & 0x70;
                        lVar10 = 0x50;
                        bVar4 = 10;
                        do {
                          buf[0xf] = buf[0xf] | uVar8 << ((char)lVar10 - 0x37U & 0x1f);
                          buf[10] = buf[10] | (uint)bVar11 << (bVar4 & 0x1f);
                          uVar18 = *(ushort *)(lVar3 + uVar14 * 2) & 0x7f00;
                          uVar1 = *(ushort *)((long)pvVar23 + lVar10 * 2);
                          *(ushort *)((long)pvVar23 + lVar10 * 2) = uVar1 & 0x80ff | uVar18;
                          uVar19 = *(ushort *)(lVar3 + uVar14 * 2) & 0x8000;
                          *(ushort *)((long)pvVar23 + lVar10 * 2) = uVar1 & 0xff | uVar18 | uVar19;
                          *(ushort *)((long)pvVar23 + lVar10 * 2) =
                               uVar1 & 0xf | uVar18 | uVar19 |
                               *(ushort *)(lVar3 + uVar14 * 2) & 0x70;
                          lVar10 = lVar10 + 1;
                          bVar4 = bVar4 + 2;
                        } while (lVar10 != 0x54);
                        lVar10 = 0;
                        do {
                          set_roi_cu8_base_cfg(buf,(RK_U32)lVar10,val);
                          uVar18 = *(ushort *)(lVar3 + uVar14 * 2) & 0x7f00;
                          uVar1 = *(ushort *)((long)pvVar23 + lVar10 * 2);
                          *(ushort *)((long)pvVar23 + lVar10 * 2) = uVar1 & 0x80ff | uVar18;
                          uVar19 = *(ushort *)(lVar3 + uVar14 * 2) & 0x8000;
                          *(ushort *)((long)pvVar23 + lVar10 * 2) = uVar1 & 0xff | uVar18 | uVar19;
                          *(ushort *)((long)pvVar23 + lVar10 * 2) =
                               uVar1 & 0xf | uVar18 | uVar19 |
                               *(ushort *)(lVar3 + uVar14 * 2) & 0x70;
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 0x40);
                      }
                      else if ((uVar21 == 0xf) && (iVar5 != 0)) {
                        uVar6 = buf[0xd] | 0x100;
                        buf[0xd] = uVar6;
                        iVar7 = 0;
                        do {
                          uVar6 = uVar6 | 0x10 << ((byte)iVar7 & 0x1f);
                          iVar7 = iVar7 + 1;
                        } while (iVar7 != 4);
                        buf[0xd] = uVar6;
                        uVar6 = 0x194;
                        do {
                          buf[uVar6 >> 5] = buf[uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
                          uVar6 = uVar6 + 1;
                        } while (uVar6 != 0x1a4);
                      }
                      uVar21 = uVar21 + 1;
                    } while (uVar21 != 0x10);
                  }
                  buf = buf + 0x10;
                  pvVar23 = (void *)((long)pvVar23 + 0xc0);
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar12);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar9);
          }
        }
      }
      else if (*(int *)((long)ctx + 8) == 7) {
        lVar3 = *(long *)((long)ctx + 0xb8);
        pvVar23 = *(void **)((long)ctx + 0x80);
        __s = *(void **)((long)ctx + 0x78);
        if (__s != (void *)0x0 && (pvVar23 != (void *)0x0 && lVar3 != 0)) {
          uVar9 = *(int *)((long)ctx + 4) + 0xf >> 4;
          uVar12 = (*ctx + 0xf >> 4) + 3U & 0xfffffffc;
          iVar5 = (uVar9 + 3 & 0xfffffffc) * uVar12;
          memset(__s,0,(long)(iVar5 * 8));
          memset(pvVar23,0,(long)(iVar5 * 2));
          if (0 < (int)uVar9) {
            lVar10 = 0;
            uVar17 = 0;
            do {
              lVar16 = lVar10;
              uVar20 = (ulong)uVar12;
              if (0 < (int)uVar12) {
                do {
                  if (*(char *)(*(long *)((long)ctx + 0xa8) + lVar16) != '\0') {
                    uVar18 = *(ushort *)(lVar3 + lVar16 * 2) & 0x7f00;
                    uVar1 = *(ushort *)((long)pvVar23 + lVar16 * 2);
                    *(ushort *)((long)pvVar23 + lVar16 * 2) = uVar1 & 0x80ff | uVar18;
                    uVar19 = *(ushort *)(lVar3 + lVar16 * 2) & 0x8000;
                    *(ushort *)((long)pvVar23 + lVar16 * 2) = uVar1 & 0xff | uVar18 | uVar19;
                    *(ushort *)((long)pvVar23 + lVar16 * 2) =
                         uVar1 & 0xf | uVar18 | uVar19 | *(ushort *)(lVar3 + lVar16 * 2) & 0x70;
                    uVar22 = (ulong)(*(ushort *)(lVar3 + lVar16 * 2) & 1) << 0x3d;
                    uVar21 = *(ulong *)((long)__s + lVar16 * 8);
                    *(ulong *)((long)__s + lVar16 * 8) = uVar21 & 0xdfffffffffffffff | uVar22;
                    *(ulong *)((long)__s + lVar16 * 8) =
                         uVar21 & 0x9fffffffffffffff | uVar22 |
                         (ulong)((*(ushort *)(lVar3 + lVar16 * 2) & 0x7f00) != 0) << 0x3e;
                  }
                  uVar20 = uVar20 - 1;
                  lVar16 = lVar16 + 1;
                } while (uVar20 != 0);
              }
              uVar17 = uVar17 + 1;
              lVar10 = lVar10 + (ulong)uVar12;
            } while (uVar17 != uVar9);
          }
        }
      }
      mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
      mpp_buffer_sync_end_f(*(undefined8 *)((long)ctx + 0x48),1,"mpp_enc_roi_setup_meta");
      uVar15 = *(undefined8 *)((long)ctx + 0x50);
    }
    else {
      if (iVar5 != 1) goto LAB_0010a446;
      if (*(int *)((long)ctx + 8) == 0x1000004) {
        gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
        uVar12 = *(int *)((long)ctx + 4) + 0x3f >> 6;
        if (0 < (int)uVar12) {
          lVar3 = *(long *)((long)ctx + 0x78);
          lVar10 = *(long *)((long)ctx + 0xb8);
          uVar9 = *ctx + 0x3f >> 6;
          uVar17 = 0;
          uVar20 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = uVar17 >> 4;
              uVar22 = 0;
              do {
                uVar14 = 0;
                do {
                  *(undefined2 *)((ulong)((uint)uVar21 & 0xfffffff) * 0x20 + lVar3 + uVar14 * 2) =
                       *(undefined2 *)
                        (lVar10 + (ulong)((((uint)(uVar14 >> 2) & 0x3fffffff) + (int)uVar20 * 4) *
                                          uVar9 * 4 + ((uint)uVar14 & 3 | (int)uVar22 * 4)) * 2);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != 0x10);
                uVar22 = uVar22 + 1;
                uVar21 = (ulong)((uint)uVar21 + 1);
              } while (uVar22 != uVar9);
            }
            uVar20 = uVar20 + 1;
            uVar17 = uVar17 + (ulong)uVar9 * 0x10;
          } while (uVar20 != uVar12);
        }
      }
      else if (*(int *)((long)ctx + 8) == 7) {
        gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0x78));
      }
      mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
      uVar15 = *(undefined8 *)((long)ctx + 0x48);
    }
    mpp_buffer_sync_end_f(uVar15,1,"mpp_enc_roi_setup_meta");
  }
LAB_0010a446:
  *(undefined4 *)((long)ctx + 0x1c) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx, MppMeta meta)
{
    MppEncRoiImpl *impl = (MppEncRoiImpl *)ctx;

    switch (impl->roi_type) {
    case ROI_TYPE_1 : {
        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu54x_roi(impl, impl->dst_base);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu54x_roi(impl, impl->tmp);
            vepu54x_h265_set_roi(impl->dst_base, impl->tmp, impl->w, impl->h);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
    } break;
    case ROI_TYPE_2 : {
        gen_vepu54x_roi(impl, impl->tmp);

        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu580_roi_h264(impl);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu580_roi_h265(impl);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
        mpp_buffer_sync_ro_end(impl->roi_cfg.qp_cfg_buf);
    } break;
    case ROI_TYPE_LEGACY : {
        MppEncROIRegion *region = impl->legacy_roi_region;
        MppEncROICfg *roi_cfg = &impl->legacy_roi_cfg;
        RoiRegionCfg *regions = impl->regions;
        RK_S32 i;

        for (i = 0; i < impl->count; i++) {
            region[i].x = regions[i].x;
            region[i].y = regions[i].y;
            region[i].w = regions[i].w;
            region[i].h = regions[i].h;

            region[i].intra = regions[i].force_intra;
            region[i].abs_qp_en = regions[i].qp_mode;
            region[i].quality = regions[i].qp_val;
            region[i].area_map_en = 1;
            region[i].qp_area_idx = 0;
        }

        roi_cfg->number = impl->count;
        roi_cfg->regions = region;

        mpp_meta_set_ptr(meta, KEY_ROI_DATA, (void*)roi_cfg);
    } break;
    default : {
    } break;
    }

    impl->count = 0;

    return MPP_OK;
}